

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-condvar.c
# Opt level: O1

void worker_config_init(worker_config_conflict *wc,int use_broadcast,signal_func signal_f,
                       wait_func wait_f)

{
  int iVar1;
  uv_cond_t *cond;
  
  memset(wc,0,0xb8);
  wc->signal_cond = signal_f;
  wc->wait_cond = wait_f;
  wc->use_broadcast = use_broadcast;
  cond = (uv_cond_t *)wc;
  iVar1 = uv_sem_init(&wc->sem_waiting,0);
  if (iVar1 == 0) {
    cond = (uv_cond_t *)&wc->sem_signaled;
    iVar1 = uv_sem_init((uv_sem_t *)cond,0);
    if (iVar1 != 0) goto LAB_0014a9b0;
    cond = &wc->cond;
    iVar1 = uv_cond_init(cond);
    if (iVar1 == 0) {
      cond = (uv_cond_t *)&wc->mutex;
      iVar1 = uv_mutex_init((uv_mutex_t *)cond);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_0014a9ba;
    }
  }
  else {
    worker_config_init_cold_1();
LAB_0014a9b0:
    worker_config_init_cold_2();
  }
  worker_config_init_cold_3();
LAB_0014a9ba:
  worker_config_init_cold_4();
  uv_mutex_destroy((uv_mutex_t *)((long)cond + 0x40));
  uv_cond_destroy((uv_cond_t *)((long)cond + 0x68));
  uv_sem_destroy((uv_sem_t *)&(cond->__data).__g1_orig_size);
  uv_sem_destroy((uv_sem_t *)cond);
  return;
}

Assistant:

void worker_config_init(worker_config* wc,
                        int use_broadcast,
                        signal_func signal_f,
                        wait_func wait_f) {
  /* Wipe. */
  memset(wc, 0, sizeof(*wc));

  /* Copy vars. */
  wc->signal_cond = signal_f;
  wc->wait_cond = wait_f;
  wc->use_broadcast = use_broadcast;

  /* Init. */
  ASSERT(0 == uv_sem_init(&wc->sem_waiting, 0));
  ASSERT(0 == uv_sem_init(&wc->sem_signaled, 0));
  ASSERT(0 == uv_cond_init(&wc->cond));
  ASSERT(0 == uv_mutex_init(&wc->mutex));
}